

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_wfopen(FILE **ppFile,wchar_t *pFilePath,wchar_t *pOpenMode,
                   ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_result mVar1;
  size_t i;
  size_t sVar2;
  char *__dst;
  long lVar3;
  FILE *pFVar4;
  int *piVar5;
  wchar_t *pFilePathTemp;
  mbstate_t mbs;
  char pOpenModeMB [32];
  
  if (ppFile != (FILE **)0x0) {
    *ppFile = (FILE *)0x0;
  }
  mVar1 = MA_INVALID_ARGS;
  if (((ppFile != (FILE **)0x0) && (pFilePath != (wchar_t *)0x0)) && (pOpenMode != (wchar_t *)0x0))
  {
    pOpenModeMB[0x10] = '\0';
    pOpenModeMB[0x11] = '\0';
    pOpenModeMB[0x12] = '\0';
    pOpenModeMB[0x13] = '\0';
    pOpenModeMB[0x14] = '\0';
    pOpenModeMB[0x15] = '\0';
    pOpenModeMB[0x16] = '\0';
    pOpenModeMB[0x17] = '\0';
    pOpenModeMB[0x18] = '\0';
    pOpenModeMB[0x19] = '\0';
    pOpenModeMB[0x1a] = '\0';
    pOpenModeMB[0x1b] = '\0';
    pOpenModeMB[0x1c] = '\0';
    pOpenModeMB[0x1d] = '\0';
    pOpenModeMB[0x1e] = '\0';
    pOpenModeMB[0x1f] = '\0';
    pOpenModeMB[0] = '\0';
    pOpenModeMB[1] = '\0';
    pOpenModeMB[2] = '\0';
    pOpenModeMB[3] = '\0';
    pOpenModeMB[4] = '\0';
    pOpenModeMB[5] = '\0';
    pOpenModeMB[6] = '\0';
    pOpenModeMB[7] = '\0';
    pOpenModeMB[8] = '\0';
    pOpenModeMB[9] = '\0';
    pOpenModeMB[10] = '\0';
    pOpenModeMB[0xb] = '\0';
    pOpenModeMB[0xc] = '\0';
    pOpenModeMB[0xd] = '\0';
    pOpenModeMB[0xe] = '\0';
    pOpenModeMB[0xf] = '\0';
    mbs.__count = 0;
    mbs.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    pFilePathTemp = pFilePath;
    sVar2 = wcsrtombs((char *)0x0,&pFilePathTemp,0,(mbstate_t *)&mbs);
    if (sVar2 == 0xffffffffffffffff) {
      piVar5 = __errno_location();
      mVar1 = ma_result_from_errno(*piVar5);
    }
    else {
      __dst = (char *)ma_malloc(sVar2 + 1,pAllocationCallbacks);
      if (__dst == (char *)0x0) {
        mVar1 = MA_OUT_OF_MEMORY;
      }
      else {
        mbs.__count = 0;
        mbs.__value = (anon_union_4_2_91654ee9_for___value)0x0;
        pFilePathTemp = pFilePath;
        wcsrtombs(__dst,&pFilePathTemp,sVar2 + 1,(mbstate_t *)&mbs);
        for (lVar3 = 0; pOpenMode[lVar3] != L'\0'; lVar3 = lVar3 + 1) {
          pOpenModeMB[lVar3] = (char)pOpenMode[lVar3];
        }
        pOpenModeMB[lVar3] = '\0';
        pFVar4 = fopen(__dst,pOpenModeMB);
        *ppFile = (FILE *)pFVar4;
        ma_free(__dst,pAllocationCallbacks);
        mVar1 = -(uint)(*ppFile == (FILE *)0x0);
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_wfopen(FILE** ppFile, const wchar_t* pFilePath, const wchar_t* pOpenMode, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (ppFile != NULL) {
        *ppFile = NULL;  /* Safety. */
    }

    if (pFilePath == NULL || pOpenMode == NULL || ppFile == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_HAS_WFOPEN)
    {
        /* Use _wfopen() on Windows. */
    #if defined(_MSC_VER) && _MSC_VER >= 1400
        errno_t err = _wfopen_s(ppFile, pFilePath, pOpenMode);
        if (err != 0) {
            return ma_result_from_errno(err);
        }
    #else
        *ppFile = _wfopen(pFilePath, pOpenMode);
        if (*ppFile == NULL) {
            return ma_result_from_errno(errno);
        }
    #endif
        (void)pAllocationCallbacks;
    }
#else
    /*
    Use fopen() on anything other than Windows. Requires a conversion. This is annoying because fopen() is locale specific. The only real way I can
    think of to do this is with wcsrtombs(). Note that wcstombs() is apparently not thread-safe because it uses a static global mbstate_t object for
    maintaining state. I've checked this with -std=c89 and it works, but if somebody get's a compiler error I'll look into improving compatibility.
    */
    {
        mbstate_t mbs;
        size_t lenMB;
        const wchar_t* pFilePathTemp = pFilePath;
        char* pFilePathMB = NULL;
        char pOpenModeMB[32] = {0};

        /* Get the length first. */
        MA_ZERO_OBJECT(&mbs);
        lenMB = wcsrtombs(NULL, &pFilePathTemp, 0, &mbs);
        if (lenMB == (size_t)-1) {
            return ma_result_from_errno(errno);
        }

        pFilePathMB = (char*)ma_malloc(lenMB + 1, pAllocationCallbacks);
        if (pFilePathMB == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        pFilePathTemp = pFilePath;
        MA_ZERO_OBJECT(&mbs);
        wcsrtombs(pFilePathMB, &pFilePathTemp, lenMB + 1, &mbs);

        /* The open mode should always consist of ASCII characters so we should be able to do a trivial conversion. */
        {
            size_t i = 0;
            for (;;) {
                if (pOpenMode[i] == 0) {
                    pOpenModeMB[i] = '\0';
                    break;
                }

                pOpenModeMB[i] = (char)pOpenMode[i];
                i += 1;
            }
        }

        *ppFile = fopen(pFilePathMB, pOpenModeMB);

        ma_free(pFilePathMB, pAllocationCallbacks);
    }

    if (*ppFile == NULL) {
        return MA_ERROR;
    }
#endif

    return MA_SUCCESS;
}